

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.test_runner.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>_>_>_>
* (anonymous_namespace)::test_case_map__abi_cxx11_(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if (test_case_map_[abi:cxx11]()::value_abi_cxx11_ != '\0') {
    return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>_>_>_>
            *)CONCAT71(in_register_00000001,test_case_map_[abi:cxx11]()::value_abi_cxx11_);
  }
  test_case_map__abi_cxx11_();
  return (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>_>_>_>
          *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

map<string, vector<const test_case*>>& test_case_map_()
    {
        static map<string, vector<const test_case*>> value;
        return value;
    }